

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O2

void __thiscall QtMWidgets::StepperPrivate::enableButtons(StepperPrivate *this)

{
  byte bVar1;
  
  if (this->wrapping == false) {
    if (this->value == this->minimum) {
      bVar1 = 1;
      if (this->minusButtonEnabled == false) {
        bVar1 = this->plusButtonEnabled ^ 1;
      }
      this->minusButtonEnabled = false;
      this->plusButtonEnabled = true;
      if (this->button != Minus) goto LAB_00165f1f;
    }
    else {
      if (this->value != this->maximum) {
        bVar1 = 1;
        if (this->minusButtonEnabled != false) {
          bVar1 = this->plusButtonEnabled ^ 1;
        }
        goto LAB_00165ee8;
      }
      bVar1 = 1;
      if (this->minusButtonEnabled != false) {
        bVar1 = this->plusButtonEnabled;
      }
      this->minusButtonEnabled = true;
      this->plusButtonEnabled = false;
      if (this->button != Plus) goto LAB_00165f1f;
    }
    QTimer::stop();
  }
  else {
    bVar1 = 1;
    if (this->minusButtonEnabled != false) {
      bVar1 = this->plusButtonEnabled ^ 1;
    }
LAB_00165ee8:
    this->minusButtonEnabled = true;
    this->plusButtonEnabled = true;
  }
LAB_00165f1f:
  if ((bVar1 & 1) == 0) {
    return;
  }
  QWidget::update();
  return;
}

Assistant:

void
StepperPrivate::enableButtons()
{
	bool needUpdate = false;

	if( !wrapping )
	{
		if( value == minimum )
		{
			needUpdate = minusButtonEnabled || !plusButtonEnabled;

			minusButtonEnabled = false;
			plusButtonEnabled = true;

			if( button == Minus )
				timer->stop();
		}
		else if( value == maximum )
		{
			needUpdate = !minusButtonEnabled || plusButtonEnabled;

			minusButtonEnabled = true;
			plusButtonEnabled = false;

			if( button == Plus )
				timer->stop();
		}
		else
		{
			needUpdate = !minusButtonEnabled || !plusButtonEnabled;

			minusButtonEnabled = true;
			plusButtonEnabled = true;
		}
	}
	else
	{
		needUpdate = !minusButtonEnabled || !plusButtonEnabled;

		minusButtonEnabled = true;
		plusButtonEnabled = true;
	}

	if( needUpdate )
		q->update();
}